

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O3

vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_> *
__thiscall
hrgls::API::GetAvailableDataBlobSources
          (vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
           *__return_storage_ptr__,API *this)

{
  API_private *pAVar1;
  int iVar2;
  mapped_type *pmVar3;
  uint uVar4;
  uint32_t count;
  DataBlobSourceDescription ri;
  char *name;
  hrgls_APIDataBlobSourceInfo info;
  allocator local_8d;
  uint local_8c;
  undefined1 *local_88;
  key_type local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  char *local_60;
  undefined8 local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->
  super__Vector_base<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_private != (API_private *)0x0) {
    iVar2 = hrgls_APIGetAvailableDataBlobSourceCount(this->m_private->m_api,&local_8c);
    pAVar1 = this->m_private;
    local_88 = (undefined1 *)pthread_self();
    local_80._M_thread = (native_handle_type)local_88;
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar1->m_status,&local_80);
    *pmVar3 = iVar2;
    if ((iVar2 == 0) && (local_8c != 0)) {
      uVar4 = 0;
      do {
        iVar2 = hrgls_APIGetAvailableDataBlobSourceInfo(this->m_private->m_api,uVar4,&local_58);
        local_80._M_thread = (native_handle_type)local_88;
        pmVar3 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&this->m_private->m_status,&local_80);
        *pmVar3 = iVar2;
        if (iVar2 != 0) {
LAB_001044ae:
          std::
          vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
          ::clear(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        iVar2 = hrgls_APIDataBlobSourceGetName(local_58,&local_60);
        local_80._M_thread = (native_handle_type)local_88;
        pmVar3 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&this->m_private->m_status,&local_80);
        *pmVar3 = iVar2;
        if (iVar2 != 0) goto LAB_001044ae;
        local_78 = 0;
        local_70[0] = 0;
        local_80._M_thread = (native_handle_type)local_70;
        std::__cxx11::string::string((string *)local_50,local_60,&local_8d);
        std::__cxx11::string::_M_assign((string *)&local_80);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        std::
        vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_80);
        if ((undefined1 *)local_80._M_thread != local_70) {
          operator_delete((void *)local_80._M_thread);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_8c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

::std::vector<DataBlobSourceDescription> API::GetAvailableDataBlobSources() const
  {
    ::std::vector<DataBlobSourceDescription> ret;
    if (!m_private) {
      return ret;
    }

    // Find out how many DataBlobSources are in the system, which will also latch the data.
    uint32_t count;
    if (hrgls_STATUS_OKAY !=
      (m_private->m_status[std::this_thread::get_id()] = hrgls_APIGetAvailableDataBlobSourceCount(m_private->m_api, &count))) {
      return ret;
    }

    // Read each DataBlobSource's information and fill it into information to be returned.
    for (uint32_t i = 0; i < count; i++) {
      hrgls_APIDataBlobSourceInfo info;
      if (hrgls_STATUS_OKAY !=
        (m_private->m_status[std::this_thread::get_id()] = hrgls_APIGetAvailableDataBlobSourceInfo(m_private->m_api,
          i, &info))) {
        ret.clear();
        return ret;
      }

      // Get and fill in the name.
      const char *name;
      if (hrgls_STATUS_OKAY !=
        (m_private->m_status[std::this_thread::get_id()] = hrgls_APIDataBlobSourceGetName(info, &name))) {
        ret.clear();
        return ret;
      }

      DataBlobSourceDescription ri;
      ri.Name(name);

      ret.push_back(ri);
    }

    return ret;
  }